

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithNaturalBoxes(Gia_Man_t *p,int nFaddMin,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *vMap_00;
  Vec_Wec_t *vChains_00;
  Vec_Int_t *vMap2Chain_00;
  Vec_Int_t *vTruths_00;
  abctime aVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *vChain_00;
  Tim_Man_t *pTVar9;
  Gia_Man_t *pGVar10;
  bool bVar11;
  int local_6c;
  int nBoxes;
  int i;
  Gia_Obj_t *pObj;
  Vec_Wec_t *vChains;
  Vec_Int_t *vChain;
  Vec_Int_t *vTruths;
  Vec_Int_t *vMap2Chain;
  Vec_Int_t *vMap;
  Vec_Int_t *vFadds;
  Gia_Man_t *pNew;
  abctime clk;
  int fVerbose_local;
  int nFaddMin_local;
  Gia_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  iVar1 = Gia_ManBoxNum(p);
  if (iVar1 < 1) {
    iVar1 = Gia_ManBoxNum(p);
    if (iVar1 != 0) {
      __assert_fail("Gia_ManBoxNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x322,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
    }
    p_00 = Gia_ManDetectFullAdders(p,fVerbose,(Vec_Int_t **)0x0);
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 % 5 != 0) {
      __assert_fail("Vec_IntSize(vFadds) % 5 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x326,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
    }
    vMap_00 = Gia_ManCreateMap(p,p_00);
    Gia_ManFindChains(p,p_00,vMap_00);
    vChains_00 = Gia_ManCollectTopmost(p,p_00,vMap_00,nFaddMin);
    if (fVerbose != 0) {
      Gia_ManPrintChains(p,p_00,vMap_00,vChains_00);
    }
    iVar1 = Vec_WecSize(vChains_00);
    if (iVar1 == 0) {
      Vec_IntFree(p_00);
      Vec_IntFree(vMap_00);
      Vec_WecFree(vChains_00);
      p_local = Gia_ManDup(p);
    }
    else {
      vMap2Chain_00 = Gia_ManFindMapping(p,p_00,vMap_00,vChains_00);
      vTruths_00 = Gia_ManCollectTruthTables(p,p_00);
      if (fVerbose != 0) {
        aVar6 = Abc_Clock();
        Abc_PrintTime(1,"Carry-chain detection time",aVar6 - aVar5);
      }
      aVar5 = Abc_Clock();
      Gia_ManFillValue(p);
      iVar1 = Gia_ManObjNum(p);
      p_local = Gia_ManStart(iVar1);
      pcVar7 = Abc_UtilStrsav(p->pName);
      p_local->pName = pcVar7;
      pcVar7 = Abc_UtilStrsav(p->pSpec);
      p_local->pSpec = pcVar7;
      pGVar8 = Gia_ManConst0(p);
      pGVar8->Value = 0;
      local_6c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar11 = false;
        if (local_6c < iVar1) {
          _nBoxes = Gia_ManCi(p,local_6c);
          bVar11 = _nBoxes != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        uVar2 = Gia_ManAppendCi(p_local);
        _nBoxes->Value = uVar2;
        local_6c = local_6c + 1;
      }
      for (local_6c = 0; iVar1 = Vec_WecSize(vChains_00), local_6c < iVar1; local_6c = local_6c + 1)
      {
        vChain_00 = Vec_WecEntry(vChains_00,local_6c);
        Gia_ManDupFadd(p_local,p,vChain_00,p_00,vMap_00,vChains_00,vMap2Chain_00,vTruths_00);
      }
      local_6c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar11 = false;
        if (local_6c < iVar1) {
          _nBoxes = Gia_ManCo(p,local_6c);
          bVar11 = _nBoxes != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        pGVar8 = Gia_ObjFanin0(_nBoxes);
        Gia_ManDupWithFaddBoxes_rec
                  (p_local,p,pGVar8,p_00,vMap_00,vChains_00,vMap2Chain_00,vTruths_00);
        local_6c = local_6c + 1;
      }
      local_6c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar11 = false;
        if (local_6c < iVar1) {
          _nBoxes = Gia_ManCo(p,local_6c);
          bVar11 = _nBoxes != (Gia_Obj_t *)0x0;
        }
        if (!bVar11) break;
        iVar1 = Gia_ObjFanin0Copy(_nBoxes);
        Gia_ManAppendCo(p_local,iVar1);
        local_6c = local_6c + 1;
      }
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_local,iVar1);
      iVar1 = Gia_ManRegNum(p);
      if (iVar1 != 0) {
        if (fVerbose != 0) {
          printf(
                "Warning: Sequential design is coverted into combinational one by adding white boxes.\n"
                );
        }
        p_local->nRegs = 0;
      }
      iVar1 = Gia_ManHasDangling(p_local);
      if (iVar1 != 0) {
        __assert_fail("!Gia_ManHasDangling(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                      ,0x353,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
      }
      Vec_IntFree(p_00);
      Vec_IntFree(vMap_00);
      Vec_WecFree(vChains_00);
      Vec_IntFree(vMap2Chain_00);
      Vec_IntFree(vTruths_00);
      iVar1 = Gia_ManCiNum(p_local);
      iVar3 = Gia_ManCiNum(p);
      iVar1 = (iVar1 - iVar3) / 2;
      iVar3 = Gia_ManCoNum(p_local);
      iVar4 = Gia_ManCoNum(p);
      if (iVar1 != (iVar3 - iVar4) / 3) {
        __assert_fail("nBoxes == (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                      ,0x35e,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
      }
      iVar3 = Gia_ManCiNum(p);
      iVar4 = Gia_ManCoNum(p);
      pTVar9 = Gia_ManGenerateTim(iVar3,iVar4,iVar1,3,2);
      p_local->pManTime = pTVar9;
      pGVar10 = Gia_ManGenerateExtraAig(iVar1,3,2);
      p_local->pAigExtra = pGVar10;
      if (fVerbose != 0) {
        aVar6 = Abc_Clock();
        Abc_PrintTime(1,"AIG with boxes construction time",aVar6 - aVar5);
      }
    }
  }
  else {
    printf("Currently natural carry-chains cannot be detected when boxes are present.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManDupWithNaturalBoxes( Gia_Man_t * p, int nFaddMin, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;//, * pTemp;
    Vec_Int_t * vFadds, * vMap, * vMap2Chain, * vTruths, * vChain;
    Vec_Wec_t * vChains;
    Gia_Obj_t * pObj;  
    int i, nBoxes;
    if ( Gia_ManBoxNum(p) > 0 )
    {
        printf( "Currently natural carry-chains cannot be detected when boxes are present.\n" );
        return NULL;
    }
    assert( Gia_ManBoxNum(p) == 0 );

    // detect FADDs
    vFadds = Gia_ManDetectFullAdders( p, fVerbose, NULL );
    assert( Vec_IntSize(vFadds) % 5 == 0 );
    // map MAJ into its FADD
    vMap = Gia_ManCreateMap( p, vFadds );
    // for each FADD, find the longest chain and reorder its inputs
    Gia_ManFindChains( p, vFadds, vMap );
    // returns the set of topmost MAJ nodes
    vChains = Gia_ManCollectTopmost( p, vFadds, vMap, nFaddMin );
    if ( fVerbose )
        Gia_ManPrintChains( p, vFadds, vMap, vChains );
    if ( Vec_WecSize(vChains) == 0 )
    {
        Vec_IntFree( vFadds );
        Vec_IntFree( vMap );
        Vec_WecFree( vChains );
        return Gia_ManDup( p );
    }
    // returns mapping of each MAJ into the topmost elements of its chain
    vMap2Chain = Gia_ManFindMapping( p, vFadds, vMap, vChains );
    // compute truth tables for FADDs
    vTruths = Gia_ManCollectTruthTables( p, vFadds );
    if ( fVerbose )
        Abc_PrintTime( 1, "Carry-chain detection time", Abc_Clock() - clk );

    // duplicate
    clk = Abc_Clock();
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Vec_WecForEachLevel( vChains, vChain, i )
        Gia_ManDupFadd( pNew, p, vChain, vFadds, vMap, vChains, vMap2Chain, vTruths );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupWithFaddBoxes_rec( pNew, p, Gia_ObjFanin0(pObj), vFadds, vMap, vChains, vMap2Chain, vTruths );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( Gia_ManRegNum(p) )
    {
        if ( fVerbose )
            printf( "Warning: Sequential design is coverted into combinational one by adding white boxes.\n" );
        pNew->nRegs = 0;
    }
    assert( !Gia_ManHasDangling(pNew) );

    // cleanup
    Vec_IntFree( vFadds );
    Vec_IntFree( vMap );
    Vec_WecFree( vChains );
    Vec_IntFree( vMap2Chain );
    Vec_IntFree( vTruths );
    
    // other information
    nBoxes = (Gia_ManCiNum(pNew) - Gia_ManCiNum(p)) / 2;
    assert( nBoxes == (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3 );
    pNew->pManTime  = Gia_ManGenerateTim( Gia_ManCiNum(p), Gia_ManCoNum(p), nBoxes, 3, 2 );
    pNew->pAigExtra = Gia_ManGenerateExtraAig( nBoxes, 3, 2 );
/*
    // normalize
    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    pNew->pManTime  = pTemp->pManTime;  pTemp->pManTime  = NULL;
    pNew->pAigExtra = pTemp->pAigExtra; pTemp->pAigExtra = NULL;
    Gia_ManStop( pTemp );
*/
    //pNew = Gia_ManDupCollapse( pTemp = pNew, pNew->pAigExtra, NULL );
    //Gia_ManStop( pTemp );

    //Gia_ManIllustrateBoxes( pNew );
    if ( fVerbose )
        Abc_PrintTime( 1, "AIG with boxes construction time", Abc_Clock() - clk );
    return pNew;
}